

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall
Genome::AddGene(Genome *this,string *name,int start,int stop,int rbs_start,int rbs_stop,
               double rbs_strength)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l_00;
  int local_f8;
  int rbs_stop_local;
  int rbs_start_local;
  int stop_local;
  shared_ptr<ReleaseSite> stop_codon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  shared_ptr<BindingSite> rbs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  term;
  double rbs_strength_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  binding;
  
  rbs_stop_local = rbs_stop;
  rbs_start_local = rbs_start;
  stop_local = stop;
  rbs_strength_local = rbs_strength;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::pair<const_char_(&)[11],_double_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)&term,(char (*) [11])"__ribosome",&rbs_strength_local);
  __l._M_len = 1;
  __l._M_array = (iterator)&term;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&binding,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &stop_codon,(allocator_type *)&local_c0);
  std::__cxx11::string::~string((string *)&term);
  local_c0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::pair<const_char_(&)[11],_double,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)&stop_codon,(char (*) [11])"__ribosome",(double *)&local_c0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stop_codon;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&term,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &rbs,(allocator_type *)&local_f8);
  std::__cxx11::string::~string((string *)&stop_codon);
  std::operator+(&local_c0,"__",name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stop_codon,
                 &local_c0,"_rbs");
  std::
  make_shared<BindingSite,std::__cxx11::string,int&,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rbs,
             (int *)&stop_codon,&rbs_start_local,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&rbs_stop_local);
  std::__cxx11::string::~string((string *)&stop_codon);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::_M_assign
            ((string *)
             &((rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_FixedElement).gene_);
  ((rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_FixedElement).
  reading_frame_ = start % 3;
  stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       ((rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_FixedElement
       ).start_;
  local_c0._M_dataplus._M_p._0_4_ =
       ((rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_FixedElement
       ).stop_;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<BindingSite>&>
            ((vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&this->transcript_rbs_intervals_,(int *)&stop_codon,(int *)&local_c0,&rbs);
  std::operator+(&local_c0,"__",name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stop_codon,
                 &local_c0,"_rbs");
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
             ::operator[](&this->bindings_,(key_type *)&stop_codon)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::operator=(this_00,&binding._M_t);
  std::__cxx11::string::~string((string *)&stop_codon);
  std::__cxx11::string::~string((string *)&local_c0);
  local_c0._M_dataplus._M_p._0_4_ = stop + -1;
  std::
  make_shared<ReleaseSite,char_const(&)[11],int,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((char (*) [11])&stop_codon,(int *)"stop_codon",(int *)&local_c0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&stop_local);
  *(int *)(CONCAT44(stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,(int)stop_codon.
                               super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr) +
          0x98) = start % 3;
  std::__cxx11::string::_M_assign
            ((string *)
             (CONCAT44(stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ._4_4_,(int)stop_codon.
                                   super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr) + 0x70));
  local_c0._M_dataplus._M_p._0_4_ =
       *(undefined4 *)
        (CONCAT44(stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,(int)stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr) + 0x38);
  local_f8 = *(int *)(CONCAT44(stop_codon.
                               super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                               _4_4_,(int)stop_codon.
                                          super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr) + 0x3c);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<ReleaseSite>&>
            ((vector<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<ReleaseSite>,unsigned_long>>>
              *)&this->transcript_stop_site_intervals_,(int *)&local_c0,&local_f8,&stop_codon);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stop_codon.super___shared_ptr<ReleaseSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rbs.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&term._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&binding._M_t);
  return;
}

Assistant:

void Genome::AddGene(const std::string &name, int start, int stop,
                     int rbs_start, int rbs_stop, double rbs_strength) {
  auto binding = std::map<std::string, double>{{"__ribosome", rbs_strength}};
  auto term = std::map<std::string, double>{{"__ribosome", 1.0}};
  auto rbs = std::make_shared<BindingSite>("__" + name + "_rbs", rbs_start,
                                           rbs_stop, binding);
  rbs->gene(name);
  rbs->reading_frame(start % 3);
  transcript_rbs_intervals_.emplace_back(rbs->start(), rbs->stop(), rbs);
  bindings_["__" + name + "_rbs"] = binding;
  auto stop_codon =
      std::make_shared<ReleaseSite>("stop_codon", stop - 1, stop, term);
  stop_codon->reading_frame(start % 3);
  stop_codon->gene(name);
  transcript_stop_site_intervals_.emplace_back(stop_codon->start(),
                                               stop_codon->stop(), stop_codon);
}